

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

int __thiscall
QFontDatabasePrivate::addAppFont(QFontDatabasePrivate *this,QByteArray *fontData,QString *fileName)

{
  ulong i;
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  int iVar5;
  qsizetype *pqVar6;
  undefined4 extraout_var;
  pointer pAVar7;
  QFontCache *this_00;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_130;
  QArrayData *local_118;
  QArrayData *pQStack_110;
  char *local_108;
  QString local_f8;
  ApplicationFont local_d8;
  QString local_88;
  QByteArray QStack_70;
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (Properties *)0x0;
  QStack_70.d.ptr = (char *)0x0;
  QStack_70.d.size = 0;
  local_88.d.size = 0;
  QStack_70.d.d = (Data *)0x0;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QByteArray::operator=(&QStack_70,fontData);
  QString::operator=(&local_88,(QString *)fileName);
  i = (this->applicationFonts).d.size;
  if (i != 0) {
    pqVar6 = &(((this->applicationFonts).d.ptr)->fileName).d.size;
    uVar9 = 0;
    do {
      if (*pqVar6 == 0) goto LAB_00495b1e;
      uVar9 = uVar9 + 1;
      pqVar6 = pqVar6 + 9;
    } while (i != uVar9);
  }
  local_d8.properties.d.d = (Data *)0x0;
  local_d8.properties.d.ptr = (Properties *)0x0;
  local_d8.data.d.ptr = (char *)0x0;
  local_d8.data.d.size = 0;
  local_d8.fileName.d.size = 0;
  local_d8.data.d.d = (Data *)0x0;
  local_d8.fileName.d.d = (Data *)0x0;
  local_d8.fileName.d.ptr = (char16_t *)0x0;
  local_d8.properties.d.size = 0;
  QtPrivate::QMovableArrayOps<QFontDatabasePrivate::ApplicationFont>::
  emplace<QFontDatabasePrivate::ApplicationFont>
            ((QMovableArrayOps<QFontDatabasePrivate::ApplicationFont> *)&this->applicationFonts,i,
             &local_d8);
  QList<QFontDatabasePrivate::ApplicationFont>::end(&this->applicationFonts);
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::~QArrayDataPointer
            (&local_d8.properties.d);
  if (&(local_d8.data.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.data.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_d8.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d8.fileName.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar9 = (ulong)((int)(this->applicationFonts).d.size - 1);
LAB_00495b1e:
  iVar8 = (int)uVar9;
  if ((local_88.d.size == 0) && ((fontData->d).size != 0)) {
    QString::number((int)&local_118,iVar8);
    local_d8.data.d.ptr = local_108;
    local_d8.data.d.d = (Data *)pQStack_110;
    local_d8.fileName.d.size = (qsizetype)local_118;
    local_d8.fileName.d.d = (Data *)0xe;
    local_d8.fileName.d.ptr = L":qmemoryfonts/";
    local_118 = (QArrayData *)0x0;
    pQStack_110 = (QArrayData *)0x0;
    local_108 = (char *)0x0;
    QStringBuilder<QLatin1String,_QString>::convertTo<QString>
              (&local_f8,(QStringBuilder<QLatin1String,_QString> *)&local_d8);
    pcVar4 = local_88.d.ptr;
    pDVar3 = local_88.d.d;
    qVar2 = local_f8.d.size;
    pDVar1 = local_f8.d.d;
    local_f8.d.d = local_88.d.d;
    local_88.d.d = pDVar1;
    local_88.d.ptr = local_f8.d.ptr;
    local_f8.d.ptr = pcVar4;
    local_f8.d.size = local_88.d.size;
    local_88.d.size = qVar2;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_d8.fileName.d.size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8.fileName.d.size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8.fileName.d.size)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8.fileName.d.size)->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_d8.fileName.d.size,2,0x10);
      }
    }
    if (local_118 != (QArrayData *)0x0) {
      LOCK();
      (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_118,2,0x10);
      }
    }
  }
  iVar5 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))
            (&local_130,(long *)CONCAT44(extraout_var,iVar5),&QStack_70,&local_88,&local_88);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_130);
  if (local_58.size == 0) {
    iVar8 = -1;
  }
  else {
    pAVar7 = QList<QFontDatabasePrivate::ApplicationFont>::data(&this->applicationFonts);
    QString::operator=(&pAVar7[iVar8].fileName,(QString *)&local_88);
    QByteArray::operator=(&pAVar7[iVar8].data,&QStack_70);
    QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::operator=
              (&pAVar7[iVar8].properties.d,&local_58);
    this_00 = QFontCache::instance();
    QFontCache::clear(this_00);
    QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::clear
              (&(this->fallbacksCache).d);
    (this->fallbacksCache).total = 0;
    (this->fallbacksCache).chain.next = &(this->fallbacksCache).chain;
    (this->fallbacksCache).chain.prev = &(this->fallbacksCache).chain;
    QGuiApplication::fontDatabaseChanged(QCoreApplication::self);
  }
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::~QArrayDataPointer
            (&local_58);
  if (&(QStack_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_70.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

int QFontDatabasePrivate::addAppFont(const QByteArray &fontData, const QString &fileName)
{
    QFontDatabasePrivate::ApplicationFont font;
    font.data = fontData;
    font.fileName = fileName;

    Q_TRACE(QFontDatabasePrivate_addAppFont, fileName);

    int i;
    for (i = 0; i < applicationFonts.size(); ++i)
        if (applicationFonts.at(i).isNull())
            break;
    if (i >= applicationFonts.size()) {
        applicationFonts.append(ApplicationFont());
        i = applicationFonts.size() - 1;
    }

    if (font.fileName.isEmpty() && !fontData.isEmpty())
        font.fileName = ":qmemoryfonts/"_L1 + QString::number(i);

    auto *platformFontDatabase = QGuiApplicationPrivate::platformIntegration()->fontDatabase();
    platformFontDatabase->addApplicationFont(font.data, font.fileName, &font);
    if (font.properties.isEmpty())
        return -1;

    applicationFonts[i] = font;

    // The font cache may have cached lookups for the font that was now
    // loaded, so it has to be flushed.
    QFontCache::instance()->clear();

    fallbacksCache.clear();

    emit qApp->fontDatabaseChanged();

    return i;
}